

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O3

spv_result_t
spvOperandTableValueLookup
          (spv_target_env param_1,spv_operand_table table,spv_operand_type_t type,uint32_t value,
          spv_operand_desc *pEntry)

{
  spv_operand_desc_group_t *psVar1;
  spv_operand_desc_t *psVar2;
  spv_result_t sVar3;
  ulong uVar4;
  ulong uVar5;
  spv_operand_desc_t *psVar6;
  difference_type __d;
  ulong uVar7;
  ulong uVar9;
  ulong uVar8;
  
  if (table == (spv_operand_table)0x0) {
    sVar3 = SPV_ERROR_INVALID_TABLE;
  }
  else {
    if (pEntry == (spv_operand_desc *)0x0) {
      return SPV_ERROR_INVALID_POINTER;
    }
    sVar3 = SPV_ERROR_INVALID_LOOKUP;
    if ((ulong)table->count != 0) {
      psVar1 = table->types;
      uVar5 = 0;
      do {
        if (psVar1[uVar5].type == type) {
          psVar2 = psVar1[uVar5].entries;
          uVar4 = (ulong)psVar1[uVar5].count;
          psVar6 = psVar2;
          uVar8 = uVar4;
          if (uVar4 != 0) {
            do {
              uVar7 = uVar8 >> 1;
              uVar9 = uVar7;
              if (psVar6[uVar7].value < value) {
                uVar9 = ~uVar7 + uVar8;
                psVar6 = psVar6 + uVar7 + 1;
              }
              uVar8 = uVar9;
            } while (0 < (long)uVar9);
          }
          if ((psVar6 != psVar2 + uVar4) && (psVar6->value == value)) {
            *pEntry = psVar6;
            return SPV_SUCCESS;
          }
        }
        uVar5 = uVar5 + 1;
        if (uVar5 == table->count) {
          return SPV_ERROR_INVALID_LOOKUP;
        }
      } while( true );
    }
  }
  return sVar3;
}

Assistant:

spv_result_t spvOperandTableValueLookup(spv_target_env,
                                        const spv_operand_table table,
                                        const spv_operand_type_t type,
                                        const uint32_t value,
                                        spv_operand_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  spv_operand_desc_t needle = {"", value,   0,  nullptr, 0,  nullptr,
                               0,  nullptr, {}, ~0u,     ~0u};

  auto comp = [](const spv_operand_desc_t& lhs, const spv_operand_desc_t& rhs) {
    return lhs.value < rhs.value;
  };

  for (uint64_t typeIndex = 0; typeIndex < table->count; ++typeIndex) {
    const auto& group = table->types[typeIndex];
    if (type != group.type) continue;

    const auto beg = group.entries;
    const auto end = group.entries + group.count;

    // Assumes the underlying table is already sorted ascendingly according to
    // opcode value.
    auto it = std::lower_bound(beg, end, needle, comp);
    if (it != end && it->value == value) {
      // The current operand is considered available as long as
      // it is in the grammar.  It might not be *valid* to use,
      // but that should be checked by the validator, not by parsing.
      *pEntry = it;
      return SPV_SUCCESS;
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}